

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

void __thiscall ki::protocol::dml::MessageTemplate::~MessageTemplate(MessageTemplate *this)

{
  Record *this_00;
  MessageTemplate *this_local;
  
  this_00 = this->m_record;
  if (this_00 != (Record *)0x0) {
    ki::dml::Record::~Record(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

MessageTemplate::~MessageTemplate()
	{
		delete m_record;
	}